

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O2

base_learner * print_setup(options_i *options,vw *all)

{
  learner<print,_example> *plVar1;
  bool print_option;
  allocator local_14a;
  allocator local_149;
  string local_148 [32];
  string local_128;
  string local_108;
  option_group_definition new_options;
  free_ptr<print> p;
  string local_80 [64];
  bool local_40;
  
  print_option = false;
  std::__cxx11::string::string((string *)&local_108,"Print psuedolearner",(allocator *)&p);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string((string *)&local_128,"print",&local_149);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)&p,&local_128,&print_option);
  local_40 = true;
  std::__cxx11::string::string(local_148,"print examples",&local_14a);
  std::__cxx11::string::_M_assign(local_80);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&new_options,(typed_option<bool> *)&p);
  std::__cxx11::string::~string(local_148);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&p);
  std::__cxx11::string::~string((string *)&local_128);
  (**options->_vptr_options_i)(options);
  if (print_option == false) {
    plVar1 = (learner<print,_example> *)0x0;
  }
  else {
    scoped_calloc_or_throw<print>();
    (p._M_t.super___uniq_ptr_impl<print,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_print_*,_void_(*)(void_*)>.super__Head_base<0UL,_print_*,_false>.
    _M_head_impl)->all = all;
    parameters::stride_shift(&all->weights,0);
    plVar1 = LEARNER::init_learner<print,example,LEARNER::learner<char,char>>(&p,learn,learn,1);
    std::unique_ptr<print,_void_(*)(void_*)>::~unique_ptr(&p);
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  return (base_learner *)plVar1;
}

Assistant:

LEARNER::base_learner* print_setup(options_i& options, vw& all)
{
  bool print_option = false;
  option_group_definition new_options("Print psuedolearner");
  new_options.add(make_option("print", print_option).keep().help("print examples"));
  options.add_and_parse(new_options);

  if (!print_option)
    return nullptr;

  auto p = scoped_calloc_or_throw<print>();
  p->all = &all;

  all.weights.stride_shift(0);

  LEARNER::learner<print, example>& ret = init_learner(p, learn, learn, 1);
  return make_base(ret);
}